

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_math_clz32(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  uint uVar2;
  JSValueUnion JVar3;
  JSValueUnion JVar4;
  JSValue JVar5;
  uint32_t a;
  uint local_c;
  
  JVar5 = *argv;
  if (0xfffffff4 < (uint)argv->tag) {
    *(int *)(argv->u).ptr = *(argv->u).ptr + 1;
  }
  iVar1 = JS_ToInt32Free(ctx,(int32_t *)&local_c,JVar5);
  if (local_c == 0) {
    uVar2 = 0x20;
  }
  else {
    uVar2 = 0x1f;
    if (local_c != 0) {
      for (; local_c >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar2 = uVar2 ^ 0x1f;
  }
  JVar3._4_4_ = 0;
  JVar3.int32 = uVar2;
  if (iVar1 != 0) {
    JVar3.float64 = 0.0;
  }
  JVar4.float64 = 2.96439387504748e-323;
  if (iVar1 == 0) {
    JVar4.float64 = 0.0;
  }
  JVar5.tag = (int64_t)JVar4.ptr;
  JVar5.u.float64 = JVar3.float64;
  return JVar5;
}

Assistant:

static JSValue js_math_clz32(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv)
{
    uint32_t a, r;

    if (JS_ToUint32(ctx, &a, argv[0]))
        return JS_EXCEPTION;
    if (a == 0)
        r = 32;
    else
        r = clz32(a);
    return JS_NewInt32(ctx, r);
}